

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_x86.c
# Opt level: O2

int funchook_write_jump32(funchook_t *funchook,uint8_t *src,uint8_t *dst,uint8_t *out)

{
  int extraout_EAX;
  
  *out = 0xe9;
  *(int *)(out + 1) = ((int)dst - (int)src) + -5;
  funchook_log(funchook,"  Write jump32 0x%016lx -> 0x%016lx\n",src,dst);
  return extraout_EAX;
}

Assistant:

static int funchook_write_jump32(funchook_t *funchook, const uint8_t *src, const uint8_t *dst, uint8_t *out)
{
    out[0] = 0xe9;
    *(int*)(out + 1) = (int)(dst - (src + 5));
    funchook_log(funchook, "  Write jump32 0x"ADDR_FMT" -> 0x"ADDR_FMT"\n",
                 (size_t)src, (size_t)dst);
    return 0;
}